

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_unicode_sets.cpp
# Opt level: O0

void anon_unknown.dwarf_22aa3b::initNumberParseUniSets(UErrorCode *status)

{
  UBool UVar1;
  UnicodeSet *pUVar2;
  UResourceBundle *pUVar3;
  undefined1 *pattern;
  char *size;
  UnicodeString *pattern_00;
  UnicodeSet *local_3c8;
  UnicodeSet *local_3b8;
  UnicodeSet *local_3a8;
  UnicodeSet *local_398;
  UnicodeSet *local_388;
  UnicodeSet *local_368;
  UnicodeSet *local_340;
  UnicodeSet *local_330;
  UnicodeSet *uniset;
  UnicodeSet **__end1;
  UnicodeSet **__begin1;
  UnicodeSet *(*__range1) [22];
  UnicodeString local_2f8;
  undefined1 local_2b1;
  UnicodeSet *local_2b0;
  byte local_2a1;
  UnicodeString local_2a0;
  undefined1 local_259;
  UnicodeSet *local_258;
  byte local_249;
  UnicodeString local_248;
  undefined1 local_201;
  UnicodeSet *local_200;
  byte local_1f1;
  UnicodeString local_1f0;
  undefined1 local_1a9;
  UnicodeSet *local_1a8;
  byte local_199;
  UnicodeString local_198;
  undefined1 local_151;
  UnicodeSet *local_150;
  byte local_141;
  UnicodeString local_140;
  undefined1 local_f9;
  UnicodeSet *local_f8;
  ParseDataSink local_f0;
  ParseDataSink sink;
  LocalPointerBase<UResourceBundle> local_e0;
  LocalUResourceBundlePointer rb;
  UnicodeString local_d0;
  undefined1 local_89;
  UnicodeSet *local_88;
  byte local_79;
  UnicodeString local_78;
  undefined1 local_31;
  UnicodeSet *local_30;
  undefined1 local_11;
  UErrorCode *local_10;
  UErrorCode *status_local;
  
  local_10 = status;
  ucln_common_registerCleanup_63(UCLN_COMMON_NUMPARSE_UNISETS,cleanupNumberParseUniSets);
  pattern = (anonymous_namespace)::gEmptyUnicodeSet;
  pUVar2 = (UnicodeSet *)icu_63::UMemory::operator_new(0x58,(anonymous_namespace)::gEmptyUnicodeSet)
  ;
  local_11 = 0;
  if (pUVar2 != (UnicodeSet *)0x0) {
    local_11 = 1;
    icu_63::UnicodeSet::UnicodeSet(pUVar2);
  }
  icu_63::UnicodeSet::freeze((UnicodeSet *)(anonymous_namespace)::gEmptyUnicodeSet);
  (anonymous_namespace)::gEmptyUnicodeSetInitialized = 1;
  pUVar2 = (UnicodeSet *)icu_63::UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  local_79 = 0;
  local_330 = (UnicodeSet *)0x0;
  if (pUVar2 != (UnicodeSet *)0x0) {
    local_31 = 1;
    local_30 = pUVar2;
    icu_63::UnicodeString::UnicodeString
              (&local_78,L"[[:Zs:][\\u0009][:Bidi_Control:][:Variation_Selector:]]");
    local_79 = 1;
    pattern = (undefined1 *)&local_78;
    icu_63::UnicodeSet::UnicodeSet(pUVar2,(UnicodeString *)pattern,local_10);
    local_330 = pUVar2;
  }
  local_31 = 0;
  DAT_00508638 = local_330;
  if ((local_79 & 1) != 0) {
    icu_63::UnicodeString::~UnicodeString(&local_78);
  }
  pUVar2 = (UnicodeSet *)icu_63::UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  rb.super_LocalPointerBase<UResourceBundle>.ptr._7_1_ = 0;
  local_340 = (UnicodeSet *)0x0;
  if (pUVar2 != (UnicodeSet *)0x0) {
    local_89 = 1;
    local_88 = pUVar2;
    icu_63::UnicodeString::UnicodeString(&local_d0,L"[[:Bidi_Control:]]");
    rb.super_LocalPointerBase<UResourceBundle>.ptr._7_1_ = 1;
    icu_63::UnicodeSet::UnicodeSet(pUVar2,&local_d0,local_10);
    local_340 = pUVar2;
  }
  local_89 = 0;
  _DAT_00508640 = local_340;
  if ((rb.super_LocalPointerBase<UResourceBundle>.ptr._7_1_ & 1) != 0) {
    icu_63::UnicodeString::~UnicodeString(&local_d0);
  }
  pUVar3 = ures_open_63((char *)0x0,"root",local_10);
  icu_63::LocalUResourceBundlePointer::LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_e0,pUVar3);
  UVar1 = ::U_FAILURE(*local_10);
  if (UVar1 == '\0') {
    ParseDataSink::ParseDataSink(&local_f0);
    pUVar3 = icu_63::LocalPointerBase<UResourceBundle>::getAlias(&local_e0);
    size = "parse";
    ures_getAllItemsWithFallback_63(pUVar3,"parse",&local_f0.super_ResourceSink,local_10);
    UVar1 = ::U_FAILURE(*local_10);
    if (UVar1 == '\0') {
      pUVar2 = (UnicodeSet *)icu_63::UMemory::operator_new((UMemory *)0x58,(size_t)size);
      local_141 = 0;
      local_368 = (UnicodeSet *)0x0;
      if (pUVar2 != (UnicodeSet *)0x0) {
        local_f9 = 1;
        local_f8 = pUVar2;
        icu_63::UnicodeString::UnicodeString
                  (&local_140,L"[\'٬‘’＇\\u0020\\u00A0\\u2000-\\u200A\\u202F\\u205F\\u3000]");
        local_141 = 1;
        icu_63::UnicodeSet::UnicodeSet(pUVar2,&local_140,local_10);
        local_368 = pUVar2;
      }
      local_f9 = 0;
      _DAT_00508668 = local_368;
      if ((local_141 & 1) != 0) {
        icu_63::UnicodeString::~UnicodeString(&local_140);
      }
      _DAT_00508670 = computeUnion(COMMA,PERIOD,OTHER_GROUPING_SEPARATORS);
      pattern_00 = (UnicodeString *)0x6;
      _DAT_00508678 = computeUnion(STRICT_COMMA,STRICT_PERIOD,OTHER_GROUPING_SEPARATORS);
      pUVar2 = (UnicodeSet *)icu_63::UMemory::operator_new((UMemory *)0x58,(size_t)pattern_00);
      local_199 = 0;
      local_388 = (UnicodeSet *)0x0;
      if (pUVar2 != (UnicodeSet *)0x0) {
        local_151 = 1;
        local_150 = pUVar2;
        icu_63::UnicodeString::UnicodeString(&local_198,L"[%٪]");
        local_199 = 1;
        pattern_00 = &local_198;
        icu_63::UnicodeSet::UnicodeSet(pUVar2,pattern_00,local_10);
        local_388 = pUVar2;
      }
      local_151 = 0;
      _DAT_00508690 = local_388;
      if ((local_199 & 1) != 0) {
        icu_63::UnicodeString::~UnicodeString(&local_198);
      }
      pUVar2 = (UnicodeSet *)icu_63::UMemory::operator_new((UMemory *)0x58,(size_t)pattern_00);
      local_1f1 = 0;
      local_398 = (UnicodeSet *)0x0;
      if (pUVar2 != (UnicodeSet *)0x0) {
        local_1a9 = 1;
        local_1a8 = pUVar2;
        icu_63::UnicodeString::UnicodeString(&local_1f0,L"[‰؉]");
        local_1f1 = 1;
        pattern_00 = &local_1f0;
        icu_63::UnicodeSet::UnicodeSet(pUVar2,pattern_00,local_10);
        local_398 = pUVar2;
      }
      local_1a9 = 0;
      _DAT_00508698 = local_398;
      if ((local_1f1 & 1) != 0) {
        icu_63::UnicodeString::~UnicodeString(&local_1f0);
      }
      pUVar2 = (UnicodeSet *)icu_63::UMemory::operator_new((UMemory *)0x58,(size_t)pattern_00);
      local_249 = 0;
      local_3a8 = (UnicodeSet *)0x0;
      if (pUVar2 != (UnicodeSet *)0x0) {
        local_201 = 1;
        local_200 = pUVar2;
        icu_63::UnicodeString::UnicodeString(&local_248,L"[∞]");
        local_249 = 1;
        pattern_00 = &local_248;
        icu_63::UnicodeSet::UnicodeSet(pUVar2,pattern_00,local_10);
        local_3a8 = pUVar2;
      }
      local_201 = 0;
      _DAT_005086a0 = local_3a8;
      if ((local_249 & 1) != 0) {
        icu_63::UnicodeString::~UnicodeString(&local_248);
      }
      pUVar2 = (UnicodeSet *)icu_63::UMemory::operator_new((UMemory *)0x58,(size_t)pattern_00);
      local_2a1 = 0;
      local_3b8 = (UnicodeSet *)0x0;
      if (pUVar2 != (UnicodeSet *)0x0) {
        local_259 = 1;
        local_258 = pUVar2;
        icu_63::UnicodeString::UnicodeString(&local_2a0,L"[¥\\uffe5]");
        local_2a1 = 1;
        pattern_00 = &local_2a0;
        icu_63::UnicodeSet::UnicodeSet(pUVar2,pattern_00,local_10);
        local_3b8 = pUVar2;
      }
      local_259 = 0;
      _DAT_005086c0 = local_3b8;
      if ((local_2a1 & 1) != 0) {
        icu_63::UnicodeString::~UnicodeString(&local_2a0);
      }
      pUVar2 = (UnicodeSet *)icu_63::UMemory::operator_new((UMemory *)0x58,(size_t)pattern_00);
      local_3c8 = (UnicodeSet *)0x0;
      if (pUVar2 != (UnicodeSet *)0x0) {
        local_2b1 = 1;
        local_2b0 = pUVar2;
        icu_63::UnicodeString::UnicodeString(&local_2f8,L"[:digit:]");
        icu_63::UnicodeSet::UnicodeSet(pUVar2,&local_2f8,local_10);
        local_3c8 = pUVar2;
      }
      local_2b1 = 0;
      _DAT_005086c8 = local_3c8;
      if (pUVar2 != (UnicodeSet *)0x0) {
        icu_63::UnicodeString::~UnicodeString(&local_2f8);
      }
      _DAT_005086d0 = computeUnion(DIGITS,ALL_SEPARATORS);
      _DAT_005086d8 = computeUnion(DIGITS,STRICT_ALL_SEPARATORS);
      for (__end1 = (UnicodeSet **)&(anonymous_namespace)::gUnicodeSets;
          __end1 != (UnicodeSet **)&icu_63::UCharCharacterIterator::getStaticClassID::classID;
          __end1 = __end1 + 1) {
        if (*__end1 != (UnicodeSet *)0x0) {
          icu_63::UnicodeSet::freeze(*__end1);
        }
      }
      sink.super_ResourceSink.super_UObject._vptr_UObject._4_4_ = 0;
    }
    else {
      sink.super_ResourceSink.super_UObject._vptr_UObject._4_4_ = 1;
    }
    ParseDataSink::~ParseDataSink(&local_f0);
  }
  else {
    sink.super_ResourceSink.super_UObject._vptr_UObject._4_4_ = 1;
  }
  icu_63::LocalUResourceBundlePointer::~LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_e0);
  return;
}

Assistant:

void U_CALLCONV initNumberParseUniSets(UErrorCode& status) {
    ucln_common_registerCleanup(UCLN_COMMON_NUMPARSE_UNISETS, cleanupNumberParseUniSets);

    // Initialize the empty instance for well-defined fallback behavior
    new(gEmptyUnicodeSet) UnicodeSet();
    reinterpret_cast<UnicodeSet*>(gEmptyUnicodeSet)->freeze();
    gEmptyUnicodeSetInitialized = TRUE;

    // These sets were decided after discussion with icu-design@. See tickets #13084 and #13309.
    // Zs+TAB is "horizontal whitespace" according to UTS #18 (blank property).
    gUnicodeSets[DEFAULT_IGNORABLES] = new UnicodeSet(
            u"[[:Zs:][\\u0009][:Bidi_Control:][:Variation_Selector:]]", status);
    gUnicodeSets[STRICT_IGNORABLES] = new UnicodeSet(u"[[:Bidi_Control:]]", status);

    LocalUResourceBundlePointer rb(ures_open(nullptr, "root", &status));
    if (U_FAILURE(status)) { return; }
    ParseDataSink sink;
    ures_getAllItemsWithFallback(rb.getAlias(), "parse", sink, status);
    if (U_FAILURE(status)) { return; }

    // NOTE: It is OK for these assertions to fail if there was a no-data build.
    U_ASSERT(gUnicodeSets[COMMA] != nullptr);
    U_ASSERT(gUnicodeSets[STRICT_COMMA] != nullptr);
    U_ASSERT(gUnicodeSets[PERIOD] != nullptr);
    U_ASSERT(gUnicodeSets[STRICT_PERIOD] != nullptr);

    gUnicodeSets[OTHER_GROUPING_SEPARATORS] = new UnicodeSet(
            u"['٬‘’＇\\u0020\\u00A0\\u2000-\\u200A\\u202F\\u205F\\u3000]", status);
    gUnicodeSets[ALL_SEPARATORS] = computeUnion(COMMA, PERIOD, OTHER_GROUPING_SEPARATORS);
    gUnicodeSets[STRICT_ALL_SEPARATORS] = computeUnion(
            STRICT_COMMA, STRICT_PERIOD, OTHER_GROUPING_SEPARATORS);

    U_ASSERT(gUnicodeSets[MINUS_SIGN] != nullptr);
    U_ASSERT(gUnicodeSets[PLUS_SIGN] != nullptr);

    gUnicodeSets[PERCENT_SIGN] = new UnicodeSet(u"[%٪]", status);
    gUnicodeSets[PERMILLE_SIGN] = new UnicodeSet(u"[‰؉]", status);
    gUnicodeSets[INFINITY_KEY] = new UnicodeSet(u"[∞]", status);

    U_ASSERT(gUnicodeSets[DOLLAR_SIGN] != nullptr);
    U_ASSERT(gUnicodeSets[POUND_SIGN] != nullptr);
    U_ASSERT(gUnicodeSets[RUPEE_SIGN] != nullptr);
    gUnicodeSets[YEN_SIGN] = new UnicodeSet(u"[¥\\uffe5]", status);

    gUnicodeSets[DIGITS] = new UnicodeSet(u"[:digit:]", status);

    gUnicodeSets[DIGITS_OR_ALL_SEPARATORS] = computeUnion(DIGITS, ALL_SEPARATORS);
    gUnicodeSets[DIGITS_OR_STRICT_ALL_SEPARATORS] = computeUnion(DIGITS, STRICT_ALL_SEPARATORS);

    for (auto* uniset : gUnicodeSets) {
        if (uniset != nullptr) {
            uniset->freeze();
        }
    }
}